

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioApi.c
# Opt level: O1

float Mio_GateReadPinDelay(Mio_Gate_t *pGate,int iPin)

{
  Mio_Pin_t *pMVar1;
  int iVar2;
  
  pMVar1 = pGate->pPins;
  if (pMVar1 != (Mio_Pin_t *)0x0) {
    iVar2 = iPin + 1;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return (float)(pMVar1->dDelayBlockRise * 0.5 + pMVar1->dDelayBlockFall * 0.5);
      }
      pMVar1 = pMVar1->pNext;
    } while (pMVar1 != (Mio_Pin_t *)0x0);
  }
  return 1e+09;
}

Assistant:

float Mio_GateReadPinDelay( Mio_Gate_t * pGate, int iPin )
{
    Mio_Pin_t * pPin;
    int i = 0;
    Mio_GateForEachPin( pGate, pPin )
        if ( i++ == iPin )
            return 0.5 * pPin->dDelayBlockRise + 0.5 * pPin->dDelayBlockFall;
    return ABC_INFINITY;
}